

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_handler.cc
# Opt level: O3

void_handler_t * make_print_message(void_handler_t *__return_storage_ptr__,string msg)

{
  long *plVar1;
  long in_RDX;
  long in_RSI;
  long *local_30;
  long local_28;
  long local_20;
  long lStack_18;
  
  local_30 = &local_20;
  std::__cxx11::string::_M_construct<char*>((string *)&local_30,in_RSI,in_RDX + in_RSI);
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  plVar1 = (long *)operator_new(0x20);
  *plVar1 = (long)(plVar1 + 2);
  if (local_30 == &local_20) {
    plVar1[2] = local_20;
    plVar1[3] = lStack_18;
  }
  else {
    *plVar1 = (long)local_30;
    plVar1[2] = local_20;
  }
  plVar1[1] = local_28;
  *(long **)&(__return_storage_ptr__->super__Function_base)._M_functor = plVar1;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/json_handler.cc:41:12)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/json_handler.cc:41:12)>
       ::_M_manager;
  return (void_handler_t *)
         std::
         _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/json_handler.cc:41:12)>
         ::_M_manager;
}

Assistant:

static JSONHandler::void_handler_t
make_print_message(std::string msg)
{
    return [msg](std::string const& path) { std::cout << path << ": json: " << msg << std::endl; };
}